

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_sync_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::subscription_sync_test::
SubscriptionSyncTest_test_encode_with_controls_Test::TestBody
          (SubscriptionSyncTest_test_encode_with_controls_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_130;
  Message local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar;
  ByteBuffer buffer;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  local_90;
  SubscriptionSync local_78 [8];
  SubscriptionSync subscription_sync;
  SubscriptionSyncTest_test_encode_with_controls_Test *this_local;
  
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::vector(&local_90,
           (vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
            *)subject_list);
  bidfx_public_api::price::pixie::SubscriptionSync::SubscriptionSync(local_78,0x7b,&local_90);
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::~vector(&local_90);
  bidfx_public_api::price::pixie::SubscriptionSync::AddControl((uint)local_78,REFRESH);
  bidfx_public_api::price::pixie::SubscriptionSync::AddControl((uint)local_78,TOGGLE);
  bidfx_public_api::price::pixie::SubscriptionSync::Encode((int)&gtest_ar + 8);
  s_abi_cxx11_(&local_100,
               "S\x02{\x02\x04\tQuantity\b2500000\aSymbol\aEURGBP\x04\tQuantity\b5600000\aSymbol\aUSDJPY\x02"
               ,0x49);
  bidfx_public_api::tools::BufferUtil::BufferAsString_abi_cxx11_((ByteBuffer *)&local_120);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_e0,
             "\"S\\002\\173\\002\\004\\011Quantity\\0102500000\\007Symbol\\007EURGBP\\004\\011Quantity\\0105600000\\007Symbol\\007USDJPY\\002\\000R\\001T\"s"
             ,"BufferUtil::BufferAsString(buffer)",&local_100,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_100);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/subscription_sync_test.cpp"
               ,0x8f,message);
    testing::internal::AssertHelper::operator=(&local_130,&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer((ByteBuffer *)&gtest_ar.message_);
  SubscriptionSync::~SubscriptionSync(local_78);
  return;
}

Assistant:

TEST(SubscriptionSyncTest, test_encode_with_controls)
{
    SubscriptionSync subscription_sync = SubscriptionSync(EDITION, subject_list);
    subscription_sync.AddControl(0, ControlOperationEnum::REFRESH);
    subscription_sync.AddControl(1, ControlOperationEnum::TOGGLE);

    ByteBuffer buffer = subscription_sync.Encode(PixieVersion::CURRENT_VERSION);
    ASSERT_EQ("S\002\173\002\004\011Quantity\0102500000\007Symbol\007EURGBP\004\011Quantity\0105600000\007Symbol\007USDJPY\002\000R\001T"s, BufferUtil::BufferAsString(buffer));
}